

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  ExpressionSyntax *pEVar2;
  Type *pTVar3;
  undefined1 auVar4 [16];
  Expression *args;
  bool bVar5;
  int iVar6;
  Delay3Control *pDVar7;
  ParamAssignmentSyntax *pPVar8;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar9;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  Diagnostic *diag;
  char *func;
  size_t index;
  bool bVar10;
  SourceRange SVar11;
  Expression *delays [3];
  Expression *local_58 [3];
  SourceRange local_40;
  
  if ((exprs->parameters).elements.size_ - 7 < 0xfffffffffffffffa) {
    SVar11 = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar11);
    local_58[0] = (Expression *)0x0;
    pDVar7 = (Delay3Control *)
             BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,(TimingControl **)local_58);
  }
  else {
    local_58[0] = (Expression *)0x0;
    local_58[1] = (Expression *)0x0;
    local_58[2] = (Expression *)0x0;
    pDVar7 = (Delay3Control *)((exprs->parameters).elements.size_ - 1);
    bVar10 = pDVar7 < (Delay3Control *)0xfffffffffffffffe;
    if (bVar10) {
      index = 0;
      do {
        pPVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
                 operator[](&exprs->parameters,index);
        SVar1 = (pPVar8->super_SyntaxNode).kind;
        this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                          (&exprs->parameters,index)->super_SyntaxNode;
        if (SVar1 != OrderedParamAssignment) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(this);
          ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar11);
LAB_00286bba:
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_40.endLoc;
          local_40 = (SourceRange)(auVar4 << 0x40);
          pDVar7 = (Delay3Control *)
                   BumpAllocator::
                   emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                             (&compilation->super_BumpAllocator,(TimingControl **)&local_40);
          break;
        }
        pOVar9 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
        pEVar2 = (pOVar9->expr).ptr;
        if (pEVar2 == (ExpressionSyntax *)0x0) {
          func = 
          "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
          ;
          goto LAB_00286c50;
        }
        iVar6 = Expression::bind((int)pEVar2,(sockaddr *)context,0);
        local_58[index] = (Expression *)CONCAT44(extraout_var_00,iVar6);
        pTVar3 = (((Expression *)CONCAT44(extraout_var_00,iVar6))->type).ptr;
        if (pTVar3 == (Type *)0x0) {
LAB_00286c24:
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_00286c50:
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,func);
        }
        bVar5 = Type::isNumeric(pTVar3);
        pDVar7 = (Delay3Control *)CONCAT71(extraout_var,bVar5);
        if (!bVar5) {
          diag = ASTContext::addDiag(context,(DiagCode)0x100008,local_58[index]->sourceRange);
          pTVar3 = (local_58[index]->type).ptr;
          if (pTVar3 != (Type *)0x0) {
            ast::operator<<(diag,pTVar3);
            goto LAB_00286bba;
          }
          goto LAB_00286c24;
        }
        index = index + 1;
        bVar10 = index < (exprs->parameters).elements.size_ + 1 >> 1;
      } while (bVar10);
    }
    args = local_58[0];
    if (!bVar10) {
      if (local_58[0] == (Expression *)0x0) {
        assert::assertFailed
                  ("delays[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/TimingControl.cpp"
                   ,0xf0,
                   "static TimingControl &slang::ast::Delay3Control::fromParams(Compilation &, const ParameterValueAssignmentSyntax &, const ASTContext &)"
                  );
      }
      local_40 = slang::syntax::SyntaxNode::sourceRange
                           (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
      pDVar7 = BumpAllocator::
               emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,args,local_58 + 1,local_58 + 2,&local_40
                         );
    }
  }
  return &pDVar7->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}